

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::IsRetainedName(string *name)

{
  bool bVar1;
  int iVar2;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  undefined1 local_27 [2];
  allocator local_25 [20];
  allocator local_11;
  undefined1 *local_10;
  
  if (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&IsRetainedName(std::__cxx11::string_const&)::
                                 retained_names_abi_cxx11_);
    if (iVar2 != 0) {
      local_10 = IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_,
                 "new",&local_11);
      local_10 = (undefined1 *)0x89e090;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 0x20),
                 "alloc",local_25);
      in_stack_ffffffffffffffa8 =
           (string *)(IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 0x40)
      ;
      local_10 = (undefined1 *)0x89e0b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)in_stack_ffffffffffffffa8,"copy",(allocator *)(local_27 + 1));
      in_stack_ffffffffffffff98 =
           (string *)(IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 0x60)
      ;
      local_10 = (undefined1 *)0x89e0d0;
      in_stack_ffffffffffffffa0 = (string *)local_27;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (in_stack_ffffffffffffff98,"mutableCopy",(allocator *)in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)local_27);
      std::allocator<char>::~allocator((allocator<char> *)(local_27 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_25);
      std::allocator<char>::~allocator((allocator<char> *)&local_11);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_);
    }
  }
  bVar1 = anon_unknown_0::IsSpecialName
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (size_t)in_stack_ffffffffffffff98);
  return bVar1;
}

Assistant:

bool IsRetainedName(const string& name) {
  // List of prefixes from
  // http://developer.apple.com/library/mac/#documentation/Cocoa/Conceptual/MemoryMgmt/Articles/mmRules.html
  static const string retained_names[] = {"new", "alloc", "copy",
                                          "mutableCopy"};
  return IsSpecialName(name, retained_names,
                       sizeof(retained_names) / sizeof(retained_names[0]));
}